

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  byte c;
  string *psVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  anon_class_1_0_00000001 to_hex_string;
  ostringstream os;
  allocator<char> local_1d1;
  __string_type local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (txt->_M_string_length != 0) {
    pbVar3 = (byte *)(txt->_M_dataplus)._M_p;
    pbVar4 = pbVar3 + txt->_M_string_length;
    do {
      c = *pbVar3;
      lVar2 = 8;
      do {
        if (*(byte *)((long)&PTR_what_001c5c18 + lVar2) == c) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,*(char **)(&DAT_001c5c20 + lVar2),&local_1d1);
          goto LAB_001a26ba;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x58);
      if (c < 0x20) {
        transformed[abi:cxx11](char)::{lambda(char)#2}::operator()[abi_cxx11_
                  (&local_1d0,&local_1d1,c);
      }
      else {
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
      }
LAB_001a26ba:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar4);
  }
  psVar1 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

inline std::string make_tran_string( std::string const & txt ) { std::ostringstream os; for(auto c:txt) os << transformed(c); return os.str(); }